

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# memory-pool.cpp
# Opt level: O3

bool __thiscall MemPool::allocBlk(MemPool *this)

{
  int iVar1;
  
  iVar1 = this->numAvailBlks;
  if (iVar1 < 1) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"MEMORY FULL",0xb);
  }
  else {
    this->blkPtr = this->memPoolPtr + this->blkSize * this->numAllocBlks;
    this->memPoolUsedBlks = this->memPoolUsedBlks + this->blkSize;
    this->numAvailBlks = iVar1 + -1;
    this->numAllocBlks = this->numAllocBlks + 1;
    this->curBlkUsed = 0;
  }
  return 0 < iVar1;
}

Assistant:

bool MemPool::allocBlk() {

    if (numAvailBlks > 0) {
        blkPtr = memPoolPtr + (numAllocBlks * blkSize); // increment blkPtr by number of allocated blocks
        memPoolUsedBlks+=blkSize;
        numAvailBlks -= 1; // decrement the available number of blocks by 1
        numAllocBlks += 1; // increment the number of allocated blocks by 1
        curBlkUsed = 0;

        return true;
    }

    else {
        cout << "MEMORY FULL";
        return false;
    }
}